

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UdpOutputPortDeclSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UdpOutputPortDeclSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *local_70;
  size_t index_local;
  UdpOutputPortDeclSyntax *this_local;
  
  switch(index) {
  case 0:
    local_70 = (SyntaxNode *)0x0;
    if (this != (UdpOutputPortDeclSyntax *)0xfffffffffffffff0) {
      local_70 = &(this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 1:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->reg).kind;
    token_00._2_1_ = (this->reg).field_0x2;
    token_00.numFlags.raw = (this->reg).numFlags.raw;
    token_00.rawLen = (this->reg).rawLen;
    token_00.info = (this->reg).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    token_01.kind = (this->name).kind;
    token_01._2_1_ = (this->name).field_0x2;
    token_01.numFlags.raw = (this->name).numFlags.raw;
    token_01.rawLen = (this->name).rawLen;
    token_01.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->initializer->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UdpOutputPortDeclSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return reg;
        case 3: return name;
        case 4: return initializer;
        default: return nullptr;
    }
}